

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O2

int RqInterExecute(RqInterProgram *pcInterProgMem,size_t nSymSize,void *pcInSymMem,
                  size_t nInSymMemSize,void *pInterSymMem,size_t nInterSymMemSize)

{
  ulong uVar1;
  int i;
  long lVar2;
  int iVar3;
  m256v IB;
  m256v Y;
  
  iVar3 = (pcInterProgMem->LU).n_col;
  uVar1 = (long)iVar3 * nSymSize;
  if (uVar1 < nInterSymMemSize || uVar1 - nInterSymMemSize == 0) {
    m256v_make(&IB,iVar3,(int)nSymSize,(uint8_t *)pInterSymMem);
    m256v_make(&Y,pcInterProgMem->nESI,(int)nSymSize,(uint8_t *)pcInSymMem);
    for (lVar2 = 0; lVar2 < (pcInterProgMem->LU).n_row; lVar2 = lVar2 + 1) {
      if (*(int *)(&pcInterProgMem->field_0x24 + lVar2 * 4) < pcInterProgMem->nESI) {
        m256v_copy_row(&Y,*(int *)(&pcInterProgMem->field_0x24 + lVar2 * 4),&IB,(int)lVar2);
      }
      else {
        m256v_clear_row(&IB,(int)lVar2);
      }
    }
    iVar3 = 0;
    m256v_LU_invmult_inplace(&pcInterProgMem->LU,-1,(int *)0x0,(int *)0x0,&IB);
  }
  else {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0xc5,"Not enough space for Intermediate block provided.");
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int RqInterExecute(const RqInterProgram* pcInterProgMem,
		   size_t nSymSize,
		   const void* pcInSymMem,
		   size_t nInSymMemSize,
		   void* pInterSymMem,
		   size_t nInterSymMemSize)
{
	/* Check memory sizes */
#if 0
	if (symbolDataSize < pcInterProgMem->nESI * nSymSize) {
		errmsg("Too little symbol data provided.");
		return RQ_ERR_ENOMEM;
	}
#endif
	if (nInterSymMemSize < pcInterProgMem->LU.n_col * nSymSize) {
		errmsg("Not enough space for Intermediate block provided.");
		return RQ_ERR_ENOMEM;
	}

	/* Create matrices */
	m256v IB = m256v_make(pcInterProgMem->LU.n_col, nSymSize, pInterSymMem);
	m256v Y = m256v_make(pcInterProgMem->nESI, nSymSize, (void*)pcInSymMem);

	/* Move data into the IB matrix */
	for (int i = 0; i < pcInterProgMem->LU.n_row; ++i) {
		const int l = pcInterProgMem->rowperm[i];
		if (l >= pcInterProgMem->nESI) {
			/* This row contains either a padded LT symbol
			 * or an LDPC symbol or an HDPC symbol.  In
			 * any case the corresponding RHS term is zero
			 */
			m256v_clear_row(&IB, i);
		} else {
			/* Row comes from an LT symbol */
			m256v_copy_row(&Y, l, &IB, i);
		}
	}

	/* Solve */
	m256v_LU_invmult_inplace(&pcInterProgMem->LU, -1, NULL, NULL, &IB);
	return 0;
}